

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,TermList *key)

{
  bool bVar1;
  type tVar2;
  TermList *in_RSI;
  uint *in_RDI;
  uint h2;
  Entry *res;
  uint pos;
  uint h1;
  Entry *local_50;
  bool local_41;
  Entry *local_40;
  uint local_2c;
  uint local_20;
  Entry *local_8;
  
  if (in_RDI[4] == 0) {
    local_8 = (Entry *)0x0;
  }
  else {
    tVar2 = DefaultHash::hash<Kernel::TermList>((TermList *)0xac54c6);
    local_20 = tVar2 % in_RDI[4];
    local_40 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_20 * 0x18);
    if ((uint)(local_40->field_0)._infoData >> 2 == *in_RDI) {
      bVar1 = Kernel::TermList::operator==(&local_40->_key,in_RSI);
      if (bVar1) {
        if (((local_40->field_0)._infoData & 1U) != 0) {
          local_40 = (Entry *)0x0;
        }
        local_8 = local_40;
      }
      else if (((uint)(local_40->field_0)._infoData >> 1 & 1) == 0) {
        local_8 = (Entry *)0x0;
      }
      else {
        tVar2 = DefaultHash2::hash<Kernel::TermList>((TermList *)0xac557f);
        local_2c = tVar2 % in_RDI[4];
        if (local_2c == 0) {
          local_2c = 1;
        }
        do {
          local_20 = (local_20 + local_2c) % in_RDI[4];
          local_50 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_20 * 0x18);
          local_41 = false;
          if ((uint)(local_50->field_0)._infoData >> 2 == *in_RDI) {
            local_41 = Kernel::TermList::operator!=(&local_50->_key,in_RSI);
          }
        } while (local_41 != false);
        if ((uint)(local_50->field_0)._infoData >> 2 == *in_RDI) {
          if (((local_50->field_0)._infoData & 1U) != 0) {
            local_50 = (Entry *)0x0;
          }
          local_8 = local_50;
        }
        else {
          local_8 = (Entry *)0x0;
        }
      }
    }
    else {
      local_8 = (Entry *)0x0;
    }
  }
  return local_8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }